

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontStructMatrix.cpp
# Opt level: O0

int __thiscall
TPZParFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>::ClassId
          (TPZParFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_> *this)

{
  uint uVar1;
  int iVar2;
  TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_> *in_stack_00000120;
  string *in_stack_ffffffffffffffc0;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  uVar1 = Hash(in_stack_ffffffffffffffc0);
  iVar2 = TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>::ClassId
                    (in_stack_00000120);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  return uVar1 ^ iVar2 << 1;
}

Assistant:

int TPZParFrontStructMatrix<TFront,TVar,TPar>::ClassId() const{
    return Hash("TPZParFrontStructMatrix") ^
        TPZFrontStructMatrix<TFront,TVar,TPar>::ClassId()<<1;
}